

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

Point getPointFromJSON(Value *point)

{
  uint row;
  Point in_RAX;
  Type pGVar1;
  Point local_18;
  
  local_18 = in_RAX;
  pGVar1 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)point,"line");
  if ((undefined1  [16])((undefined1  [16])pGVar1->data_ & (undefined1  [16])0x40000000000000) !=
      (undefined1  [16])0x0) {
    row = (pGVar1->data_).s.length;
    pGVar1 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)point,"character");
    if ((undefined1  [16])((undefined1  [16])pGVar1->data_ & (undefined1  [16])0x40000000000000) !=
        (undefined1  [16])0x0) {
      Point::Point(&local_18,row,(pGVar1->data_).s.length);
      return local_18;
    }
  }
  __assert_fail("data_.f.flags & kUintFlag",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/rapidjson/include/rapidjson/document.h"
                ,0x6c4,
                "unsigned int rapidjson::GenericValue<rapidjson::UTF8<>>::GetUint() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

Point getPointFromJSON (rapidjson::Value &point) {
    unsigned line = point["line"].GetUint();
    unsigned character = point["character"].GetUint();

    return Point { line, character };
}